

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_add(zt_ptr_array *array,void *data)

{
  long in_RSI;
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RSI == 0) || (in_RDI == (int *)0x0)) {
    iVar1 = 0;
  }
  else if ((in_RDI[1] < *in_RDI) ||
          (iVar1 = zt_ptr_array_resize((zt_ptr_array *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(int32_t)((ulong)in_RDI >> 0x20)), -1 < iVar1)) {
    *(long *)(*(long *)(in_RDI + 2) + (long)in_RDI[1] * 8) = in_RSI;
    in_RDI[1] = in_RDI[1] + 1;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
zt_ptr_array_add(zt_ptr_array * array, void * data) {
    if (data == NULL || array == NULL) {
        return 0;
    }

    if (zt_ptr_array_is_full(array)) {
        if (zt_ptr_array_resize(array, 0) < 0) {
            return -1;
        }
    }

    array->array[array->count] = data;
    array->count++;

    return 0;
}